

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O2

void __thiscall
boost::exception_detail::
clone_impl<boost::exception_detail::error_info_injector<std::runtime_error>_>::clone_impl
          (clone_impl<boost::exception_detail::error_info_injector<std::runtime_error>_> *this,
          error_info_injector<std::runtime_error> *x)

{
  *(undefined ***)&this->field_0x38 = &PTR___cxa_pure_virtual_00128f38;
  error_info_injector<std::runtime_error>::error_info_injector
            (&this->super_error_info_injector<std::runtime_error>,x);
  *(undefined8 *)&this->super_error_info_injector<std::runtime_error> = 0x129910;
  (this->super_error_info_injector<std::runtime_error>).super_exception._vptr_exception =
       (_func_int **)0x129948;
  *(undefined8 *)&this->field_0x38 = 0x129980;
  copy_boost_exception
            (&(this->super_error_info_injector<std::runtime_error>).super_exception,
             &x->super_exception);
  return;
}

Assistant:

explicit
            clone_impl( T const & x ):
                T(x)
                {
                copy_boost_exception(this,&x);
                }